

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O1

void __thiscall sjtu::TrainManager::delete_train(TrainManager *this,int argc,string *argv)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar1;
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *this_00;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  size_t sVar4;
  pair<unsigned_int,_bool> pVar5;
  invalid_command *this_01;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  char *__s;
  TrainManager *this_02;
  pair<long,_bool> pVar12;
  string trainID;
  ulong local_e0;
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  TrainManager *local_b8;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long local_90;
  char local_88;
  ulong local_80;
  long local_78;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_d8 = &local_c8;
  local_d0 = 0;
  local_c8 = 0;
  local_b8 = this;
  if (0 < argc) {
    iVar8 = 0;
    do {
      iVar2 = std::__cxx11::string::compare((char *)argv);
      if (iVar2 != 0) {
        this_01 = (invalid_command *)__cxa_allocate_exception(0x68);
        invalid_command::invalid_command(this_01);
        __cxa_throw(this_01,&invalid_command::typeinfo,invalid_command::~invalid_command);
      }
      std::__cxx11::string::_M_assign((string *)&local_d8);
      argv = argv + 2;
      iVar8 = iVar8 + 2;
    } while (iVar8 < argc);
  }
  this_02 = local_b8;
  pBVar1 = local_b8->TrainBpTree;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_d8,local_d8 + local_d0);
  if (local_48 == 0) {
    local_e0 = 0;
  }
  else {
    lVar10 = 0;
    lVar6 = 0;
    local_e0 = 0;
    do {
      uVar9 = (ulong)((int)*(char *)((long)local_50 + lVar10) + 0x100);
      lVar6 = (long)(lVar6 * 0x239 + uVar9) % 0x3b800001;
      local_e0 = (long)(local_e0 * 0x301 + uVar9) % 0x3b9aca07;
      lVar10 = lVar10 + 1;
    } while (local_48 != lVar10);
    local_e0 = lVar6 << 0x20 | local_e0;
  }
  pVar12 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (pBVar1,&local_e0);
  local_90 = pVar12.first;
  local_88 = pVar12.second;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_88 == '\0') {
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  else {
    iVar8 = (*(this_02->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base
              [2])(this_02->TrainFile,&local_90);
    lVar6 = CONCAT44(extraout_var,iVar8);
    if (*(char *)(lVar6 + 0xa799) == '\x01') {
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    }
    else {
      if (0 < *(int *)(lVar6 + 0x18)) {
        local_80 = (ulong)((int)(*(ulong *)(lVar6 + 0xa7a0) / 0xa7a8) - 1);
        local_78 = lVar6 + 0x20;
        lVar10 = 0;
        do {
          this_00 = this_02->StationBpTree;
          __s = (char *)(lVar10 * 0x1a8 + local_78);
          local_b0 = local_a0;
          sVar4 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,__s,__s + sVar4);
          this_02 = local_b8;
          if (local_a8 == 0) {
            local_e0 = 0;
          }
          else {
            lVar11 = 0;
            lVar7 = 0;
            local_e0 = 0;
            do {
              uVar9 = (ulong)((int)*(char *)((long)local_b0 + lVar11) + 0x100);
              lVar7 = (long)(lVar7 * 0x239 + uVar9) % 0x3b800001;
              local_e0 = (long)(local_e0 * 0x301 + uVar9) % 0x3b9aca07;
              lVar11 = lVar11 + 1;
            } while (local_a8 != lVar11);
            local_e0 = lVar7 << 0x20 | local_e0;
          }
          pVar5 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::
                  find(this_00,&local_e0);
          if (local_b0 != local_a0) {
            operator_delete(local_b0,local_a0[0] + 1);
          }
          bitset_set(this_02,pVar5.first,(uint)local_80,0);
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)(lVar6 + 0x18));
      }
      pBVar1 = this_02->TrainBpTree;
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_d8,local_d8 + local_d0);
      if (local_68 == 0) {
        local_e0 = 0;
      }
      else {
        lVar10 = 0;
        lVar6 = 0;
        local_e0 = 0;
        do {
          uVar9 = (ulong)((int)*(char *)((long)local_70 + lVar10) + 0x100);
          lVar6 = (long)(lVar6 * 0x239 + uVar9) % 0x3b800001;
          local_e0 = (long)(local_e0 * 0x301 + uVar9) % 0x3b9aca07;
          lVar10 = lVar10 + 1;
        } while (local_68 != lVar10);
        local_e0 = lVar6 << 0x20 | local_e0;
      }
      BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::erase
                (pBVar1,&local_e0);
      DynamicFileManager<sjtu::trainType>::release(this_02->TrainFile,local_90);
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    }
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  return;
}

Assistant:

void delete_train(int argc , std::string *argv)
		{
			std::string trainID;
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-i") trainID = argv[i + 1];
				else throw invalid_command();
			auto ret = TrainBpTree -> find(hasher(trainID));
			if (ret.second == false) std::cout << -1 << std::endl;
			else
			{
				trainType *train = TrainFile -> read(ret.first);
				if (train -> is_released == true) std::cout << -1 << std::endl;
				else
				{
					for (int i = 0 , train_id = train -> offset / sizeof (DynamicFileManager<trainType>::valueType) - 1;i < train -> stationNum;++ i)
					{
						int id = StationBpTree -> find(hasher(train -> stations[i].stationName)).first;
						bitset_set(id , train_id , 0);
					}
					TrainBpTree -> erase(hasher(trainID)) , TrainFile -> release(ret.first);
					std::cout << 0 << std::endl;
				}
			}
		}